

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_compare_fflags(char *file,wchar_t line,char *patha,char *pathb,wchar_t nomatch)

{
  uint local_44;
  uint local_40;
  wchar_t flagsb;
  wchar_t flagsa;
  wchar_t r;
  wchar_t fd;
  wchar_t nomatch_local;
  char *pathb_local;
  char *patha_local;
  char *pcStack_18;
  wchar_t line_local;
  char *file_local;
  
  r = nomatch;
  _fd = pathb;
  pathb_local = patha;
  patha_local._4_4_ = line;
  pcStack_18 = file;
  assertion_count(file,line);
  flagsa = open(pathb_local,0x800);
  if (flagsa < L'\0') {
    failure_start(pcStack_18,patha_local._4_4_,"Can\'t open %s\n",pathb_local);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  else {
    flagsb = ioctl(flagsa,0x80086601,&local_40);
    close(flagsa);
    if (flagsb < L'\0') {
      failure_start(pcStack_18,patha_local._4_4_,"Can\'t get flags %s\n",pathb_local);
      failure_finish((void *)0x0);
      file_local._4_4_ = L'\0';
    }
    else {
      flagsa = open(_fd,0x800);
      if (flagsa < L'\0') {
        failure_start(pcStack_18,patha_local._4_4_,"Can\'t open %s\n",_fd);
        failure_finish((void *)0x0);
        file_local._4_4_ = L'\0';
      }
      else {
        flagsb = ioctl(flagsa,0x80086601,&local_44);
        close(flagsa);
        if (flagsb < L'\0') {
          failure_start(pcStack_18,patha_local._4_4_,"Can\'t get flags %s\n",_fd);
          failure_finish((void *)0x0);
          file_local._4_4_ = L'\0';
        }
        else if ((r == L'\0') && (local_40 != local_44)) {
          failure_start(pcStack_18,patha_local._4_4_,
                        "File flags should be identical: %s=%#010x %s=%#010x",pathb_local,
                        (ulong)local_40,_fd,local_44);
          failure_finish((void *)0x0);
          file_local._4_4_ = L'\0';
        }
        else if ((r == L'\0') || (local_40 != local_44)) {
          file_local._4_4_ = L'\x01';
        }
        else {
          failure_start(pcStack_18,patha_local._4_4_,
                        "File flags should be different: %s=%#010x %s=%#010x",pathb_local,
                        (ulong)local_40,_fd,local_44);
          failure_finish((void *)0x0);
          file_local._4_4_ = L'\0';
        }
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_compare_fflags(const char *file, int line, const char *patha,
    const char *pathb, int nomatch)
{
#if defined(HAVE_STRUCT_STAT_ST_FLAGS) && defined(UF_NODUMP)
	struct stat sa, sb;

	assertion_count(file, line);

	if (stat(patha, &sa) < 0)
		return (0);
	if (stat(pathb, &sb) < 0)
		return (0);
	if (!nomatch && sa.st_flags != sb.st_flags) {
		failure_start(file, line, "File flags should be identical: "
		    "%s=%#010x %s=%#010x", patha, sa.st_flags, pathb,
		    sb.st_flags);
		failure_finish(NULL);
		return (0);
	}
	if (nomatch && sa.st_flags == sb.st_flags) {
		failure_start(file, line, "File flags should be different: "
		    "%s=%#010x %s=%#010x", patha, sa.st_flags, pathb,
		    sb.st_flags);
		failure_finish(NULL);
		return (0);
	}
#elif (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS) && \
       defined(FS_NODUMP_FL)) || \
      (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS) \
         && defined(EXT2_NODUMP_FL))
	int fd, r, flagsa, flagsb;

	assertion_count(file, line);
	fd = open(patha, O_RDONLY | O_NONBLOCK);
	if (fd < 0) {
		failure_start(file, line, "Can't open %s\n", patha);
		failure_finish(NULL);
		return (0);
	}
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flagsa);
	close(fd);
	if (r < 0) {
		failure_start(file, line, "Can't get flags %s\n", patha);
		failure_finish(NULL);
		return (0);
	}
	fd = open(pathb, O_RDONLY | O_NONBLOCK);
	if (fd < 0) {
		failure_start(file, line, "Can't open %s\n", pathb);
		failure_finish(NULL);
		return (0);
	}
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flagsb);
	close(fd);
	if (r < 0) {
		failure_start(file, line, "Can't get flags %s\n", pathb);
		failure_finish(NULL);
		return (0);
	}
	if (!nomatch && flagsa != flagsb) {
		failure_start(file, line, "File flags should be identical: "
		    "%s=%#010x %s=%#010x", patha, flagsa, pathb, flagsb);
		failure_finish(NULL);
		return (0);
	}
	if (nomatch && flagsa == flagsb) {
		failure_start(file, line, "File flags should be different: "
		    "%s=%#010x %s=%#010x", patha, flagsa, pathb, flagsb);
		failure_finish(NULL);
		return (0);
	}
#else
	(void)patha; /* UNUSED */
	(void)pathb; /* UNUSED */
	(void)nomatch; /* UNUSED */
	assertion_count(file, line);
#endif
	return (1);
}